

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortDnaSequence.cpp
# Opt level: O2

double __thiscall ShortDnaSequence::qualityCorrect(ShortDnaSequence *this,size_t pos)

{
  char cVar1;
  double dVar2;
  
  cVar1 = qualityChar(this,pos);
  dVar2 = pow(10.0,(double)(0x21 - cVar1) / 10.0);
  return 1.0 - dVar2;
}

Assistant:

double ShortDnaSequence::qualityCorrect(size_t pos) const {
    return 1 - pow(10, -(qualityChar(pos)-33)/10.0);
}